

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

int ssl_ui_reader(UI *ui,UI_STRING *uis)

{
  UI_string_types UVar1;
  uint uVar2;
  int iVar3;
  char *result;
  UI_METHOD *pUVar4;
  undefined4 extraout_var;
  UI_STRING *pUVar5;
  char *password;
  UI_STRING *uis_local;
  UI *ui_local;
  
  pUVar5 = uis;
  UVar1 = UI_get_string_type((UI_STRING *)uis);
  if (((UVar1 == UIT_PROMPT || UVar1 == UIT_VERIFY) &&
      (result = (char *)UI_get0_user_data((UI *)ui), result != (char *)0x0)) &&
     (uVar2 = UI_get_input_flags((UI_STRING *)uis), (uVar2 & 2) != 0)) {
    UI_set_result((UI *)ui,(UI_STRING *)uis,result);
    ui_local._4_4_ = 1;
  }
  else {
    pUVar4 = UI_OpenSSL();
    iVar3 = UI_method_get_reader((UI *)pUVar4,(UI_STRING *)pUVar5);
    ui_local._4_4_ = (*(code *)CONCAT44(extraout_var,iVar3))(ui,uis);
  }
  return ui_local._4_4_;
}

Assistant:

static int ssl_ui_reader(UI *ui, UI_STRING *uis)
{
  const char *password;
  switch(UI_get_string_type(uis)) {
  case UIT_PROMPT:
  case UIT_VERIFY:
    password = (const char*)UI_get0_user_data(ui);
    if(password && (UI_get_input_flags(uis) & UI_INPUT_FLAG_DEFAULT_PWD)) {
      UI_set_result(ui, uis, password);
      return 1;
    }
  default:
    break;
  }
  return (UI_method_get_reader(UI_OpenSSL()))(ui, uis);
}